

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::end_query(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint id;
  NegativeTestContext *ctx_local;
  
  local_14 = 0;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,1,&local_14);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glEndQuery(&pNStack_10->super_CallLogWrapper,0xffffffff);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if ctx.glEndQuery is executed when a query object of the same target is not active."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glEndQuery(&pNStack_10->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(pNStack_10,0x502);
  glu::CallLogWrapper::glBeginQuery(&pNStack_10->super_CallLogWrapper,0x8c2f,local_14);
  NegativeTestContext::expectError(pNStack_10,0);
  glu::CallLogWrapper::glEndQuery(&pNStack_10->super_CallLogWrapper,0x8c88);
  NegativeTestContext::expectError(pNStack_10,0x502);
  glu::CallLogWrapper::glEndQuery(&pNStack_10->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(pNStack_10,0);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteQueries(&pNStack_10->super_CallLogWrapper,1,&local_14);
  NegativeTestContext::expectError(pNStack_10,0);
  return;
}

Assistant:

void end_query (NegativeTestContext& ctx)
{
	GLuint id = 0;
	ctx.glGenQueries	(1, &id);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glEndQuery		(-1);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glEndQuery is executed when a query object of the same target is not active.");
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, id);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glEndQuery		(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_NO_ERROR);
	ctx.endSection();

	ctx.glDeleteQueries	(1, &id);
	ctx.expectError		(GL_NO_ERROR);
}